

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuThreads.cpp
# Opt level: O2

Value __thiscall xmrig::CpuThreads::toJSON(CpuThreads *this,Document *doc)

{
  SizeType SVar1;
  int iVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document *pDVar3;
  uint value;
  long in_RDX;
  long extraout_RDX;
  long extraout_RDX_00;
  CpuThread *thread;
  Document *doc_00;
  Value VVar4;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  CpuThread local_40;
  
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
  SVar1 = (doc->
          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ).data_.s.length;
  *(undefined8 *)this = 0;
  this->m_affinity = 0;
  if (SVar1 == 0) {
    *(undefined2 *)((long)&this->m_affinity + 6) = 4;
    pDVar3 = (Document *)doc->ownAllocator_;
    for (doc_00 = (Document *)doc->allocator_; doc_00 != pDVar3;
        doc_00 = (Document *)&doc_00->allocator_) {
      CpuThread::toJSON(&local_40,doc_00);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_40,allocator);
      in_RDX = extraout_RDX;
    }
  }
  else {
    *(undefined2 *)((long)&this->m_affinity + 6) = 3;
    local_70.s = "intensity";
    local_70.length = 9;
    if (doc->allocator_ == doc->ownAllocator_) {
      value = 1;
    }
    else {
      iVar2 = (int)doc->allocator_->chunk_capacity_;
      value = iVar2 + (uint)(iVar2 == 0);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this,&local_70,value,allocator);
    local_50.s = "threads";
    local_50.length = 7;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this,&local_50,
               (uint)((ulong)((long)doc->ownAllocator_ - (long)doc->allocator_) >> 4),allocator);
    local_60.s = "affinity";
    local_60.length = 8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<long>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)this,&local_60,
                    (long)(doc->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ).data_.s.str,allocator);
    in_RDX = extraout_RDX_00;
  }
  VVar4.data_.s.str = (Ch *)in_RDX;
  VVar4.data_.n = (Number)this;
  return (Value)VVar4.data_;
}

Assistant:

rapidjson::Value xmrig::CpuThreads::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out;

    if (m_format == ArrayFormat) {
        out.SetArray();

        for (const CpuThread &thread : m_data) {
            out.PushBack(thread.toJSON(doc), allocator);
        }
    }
    else {
        out.SetObject();

        out.AddMember(StringRef(kIntensity), m_data.empty() ? 1 : m_data.front().intensity(), allocator);
        out.AddMember(StringRef(kThreads), static_cast<unsigned>(m_data.size()), allocator);
        out.AddMember(StringRef(kAffinity), m_affinity, allocator);
    }

    return out;
}